

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

iterator __thiscall
QMap<QString,_QVariant>::insert
          (QMap<QString,_QVariant> *this,const_iterator pos,QString *key,QVariant *value)

{
  totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
  tVar1;
  difference_type __n;
  iterator iVar2;
  totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
  tVar3;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  tVar1.ptr = (this->d).d.ptr;
  if ((tVar1.ptr ==
       (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &((tVar1.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
          )(QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)0x0;
    tVar3.ptr = tVar1.ptr;
  }
  else {
    LOCK();
    ((tVar1.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)((tVar1.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
    tVar3.ptr = (this->d).d.ptr;
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
          )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
            )tVar1.ptr;
  }
  if (tVar3.ptr ==
      (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
       *)0x0) {
    __n = 0;
  }
  else {
    if ((__int_type)
        ((tVar3.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 1) goto LAB_00107bed;
    __n = std::__distance<std::_Rb_tree_const_iterator<std::pair<QString_const,QVariant>>>
                    (((tVar3.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  detach(this);
  pos.i._M_node =
       std::next<std::_Rb_tree_const_iterator<std::pair<QString_const,QVariant>>>
                 (*(_Base_ptr *)
                   ((long)&(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header +
                   0x10),__n);
  tVar3.ptr = (this->d).d.ptr;
LAB_00107bed:
  iVar2 = std::
          map<QString,QVariant,std::less<QString>,std::allocator<std::pair<QString_const,QVariant>>>
          ::insert_or_assign<QVariant_const&>
                    ((map<QString,QVariant,std::less<QString>,std::allocator<std::pair<QString_const,QVariant>>>
                      *)&(tVar3.ptr)->m,pos.i,key,value);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)(iterator)iVar2._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const_iterator pos, const Key &key, const T &value)
    {
        // TODO: improve. In case of assignment, why copying first?
        typename Map::const_iterator dpos;
        const auto copy = d.isShared() ? *this : QMap(); // keep `key`/`value` alive across the detach
        if (!d || d.isShared()) {
            auto posDistance = d ? std::distance(d->m.cbegin(), pos.i) : 0;
            detach();
            dpos = std::next(d->m.cbegin(), posDistance);
        } else {
            dpos = pos.i;
        }
        return iterator(d->m.insert_or_assign(dpos, key, value));
    }